

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  pointer pcVar1;
  cmGlobalGenerator *this_00;
  size_t sVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  const_iterator cVar6;
  FrameworkFormat format;
  pointer pcVar7;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  ostringstream e;
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  string local_270;
  void *local_250;
  ItemIsPath local_244;
  FeatureDescriptor *local_240;
  FeatureDescriptor *local_238;
  undefined1 local_230 [112];
  ios_base local_1c0 [264];
  _Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> local_b8;
  
  this_00 = this->GlobalGenerator;
  sVar2 = (entry->Feature)._M_string_length;
  format = Extended;
  if (sVar2 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) {
    if (sVar2 != 0) {
      iVar3 = bcmp((entry->Feature)._M_dataplus._M_p,
                   (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar2);
      if (iVar3 != 0) goto LAB_004d35ec;
    }
    format = Relaxed;
  }
LAB_004d35ec:
  cmGlobalGenerator::SplitFrameworkPath
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)&local_b8,this_00,(string *)entry,
             format);
  if (local_b8._M_engaged == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"Could not parse framework path \"",0x20);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(entry->Item).Value._M_dataplus._M_p,
                        (entry->Item).Value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" linked by target ",0x13);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    local_270._M_dataplus._M_p._0_1_ = 0x2e;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_270,1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    std::ios_base::~ios_base(local_1c0);
    goto LAB_004d39b7;
  }
  if (local_b8._M_payload._M_value.Directory._M_string_length != 0) {
    pVar8 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->FrameworkPathsEmitted,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->FrameworkPaths,(value_type *)&local_b8);
    }
  }
  cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
            ((string *)local_230,(FrameworkDescriptor *)&local_b8);
  AddLibraryRuntimeInfo(this,(string *)local_230);
  pcVar1 = local_230 + 0x10;
  if ((pointer)local_230._0_8_ != pcVar1) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  sVar2 = (entry->Feature)._M_string_length;
  if (sVar2 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) {
    if (sVar2 != 0) {
      iVar3 = bcmp((entry->Feature)._M_dataplus._M_p,
                   (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar2);
      if (iVar3 != 0) goto LAB_004d36e7;
    }
    local_230._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"FRAMEWORK","");
    AddLibraryFeature(this,(string *)local_230);
    if ((pointer)local_230._0_8_ != pcVar1) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
  }
LAB_004d36e7:
  iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
  if ((char)iVar3 == '\0') {
    cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
              ((string *)local_230,(FrameworkDescriptor *)&local_b8);
    local_244 = Yes;
    local_250 = (void *)0x0;
    local_238 = (FeatureDescriptor *)0x0;
    sVar2 = (entry->Feature)._M_string_length;
    if (sVar2 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) {
      if (sVar2 != 0) {
        pcVar7 = (entry->Feature)._M_dataplus._M_p;
        iVar3 = bcmp(pcVar7,(void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar2);
        if (iVar3 != 0) goto LAB_004d3920;
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"FRAMEWORK","");
    }
    else {
      pcVar7 = (entry->Feature)._M_dataplus._M_p;
LAB_004d3920:
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_270,pcVar7,pcVar7 + sVar2);
    }
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,&local_270);
    local_240 = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar6._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_240 = (FeatureDescriptor *)(cVar6._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,&local_244,&local_250,&local_238,&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_240 = (FeatureDescriptor *)CONCAT44(local_240._4_4_,1);
    local_270._M_dataplus._M_p = (pointer)0x0;
    local_250 = (void *)0x0;
    sVar2 = (entry->Feature)._M_string_length;
    if (sVar2 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) {
      if (sVar2 != 0) {
        pcVar7 = (entry->Feature)._M_dataplus._M_p;
        iVar3 = bcmp(pcVar7,(void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar2);
        if (iVar3 != 0) goto LAB_004d38ba;
      }
      local_230._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"FRAMEWORK","");
    }
    else {
      pcVar7 = (entry->Feature)._M_dataplus._M_p;
LAB_004d38ba:
      local_230._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>((string *)local_230,pcVar7,pcVar7 + sVar2);
    }
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_230);
    local_238 = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar6._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_238 = (FeatureDescriptor *)(cVar6._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry,
               (ItemIsPath *)&local_240,(void **)&local_270,&local_250,&local_238);
  }
  if ((pointer)local_230._0_8_ != pcVar1) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
LAB_004d39b7:
  if (local_b8._M_engaged == true) {
    std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_destroy(&local_b8);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(LinkEntry const& entry)
{
  std::string const& item = entry.Item.Value;

  // Try to separate the framework name and path.
  auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
    item,
    entry.Feature == DEFAULT ? cmGlobalGenerator::FrameworkFormat::Relaxed
                             : cmGlobalGenerator::FrameworkFormat::Extended);
  if (!fwDescriptor) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" linked by target "
      << this->Target->GetName() << '.';
    cmSystemTools::Error(e.str());
    return;
  }

  const std::string& fw_path = fwDescriptor->Directory;
  if (!fw_path.empty()) {
    // Add the directory portion to the framework search path.
    this->AddFrameworkPath(fw_path);
  }

  // add runtime information
  this->AddLibraryRuntimeInfo(fwDescriptor->GetFullPath());

  if (entry.Feature == DEFAULT) {
    // ensure FRAMEWORK feature is loaded
    this->AddLibraryFeature("FRAMEWORK");
  }

  if (this->GlobalGenerator->IsXcode()) {
    // Add framework path - it will be handled by Xcode after it's added to
    // "Link Binary With Libraries" build phase
    this->Items.emplace_back(item, ItemIsPath::Yes, nullptr, nullptr,
                             this->FindLibraryFeature(entry.Feature == DEFAULT
                                                        ? "FRAMEWORK"
                                                        : entry.Feature));
  } else {
    this->Items.emplace_back(
      fwDescriptor->GetLinkName(), ItemIsPath::Yes, nullptr, nullptr,
      this->FindLibraryFeature(entry.Feature == DEFAULT ? "FRAMEWORK"
                                                        : entry.Feature));
  }
}